

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall pbrt::ParameterDictionary::remove(ParameterDictionary *this,char *__filename)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  ParsedParameter **ppPVar2;
  __type_conflict _Var3;
  bool bVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  iterator ppPVar6;
  char *in_RDX;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *cpos;
  
  paVar5 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  paVar1 = &(this->params).field_2;
  cpos = paVar5;
  if (paVar5 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    cpos = paVar1;
  }
  while( true ) {
    if (paVar5 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar5 = paVar1;
    }
    ppPVar2 = (ParsedParameter **)((long)paVar5 + (this->params).nStored * 8);
    if (cpos == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)ppPVar2) break;
    _Var3 = std::operator==(&cpos->fixed[0]->name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __filename);
    if (_Var3) {
      bVar4 = std::operator==(&cpos->fixed[0]->type,in_RDX);
      if (bVar4) {
        ppPVar6 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  ::erase(&this->params,cpos->fixed);
        return (int)ppPVar6;
      }
    }
    paVar5 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(this->params).ptr;
    cpos = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)((long)cpos + 8);
  }
  return (int)ppPVar2;
}

Assistant:

void ParameterDictionary::remove(const std::string &name, const char *typeName) {
    for (auto iter = params.begin(); iter != params.end(); ++iter)
        if ((*iter)->name == name && (*iter)->type == typeName) {
            params.erase(iter);
            return;
        }
}